

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_8,_12>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  Vector<float,_3> *pVVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  Vector<float,_3> *pVVar7;
  float *pfVar8;
  int col;
  long lVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  float fVar13;
  Mat3x2 m;
  Mat4x3 m_1;
  Matrix<float,_2,_3> local_b8;
  float afStack_a0 [2];
  undefined8 local_98;
  float local_90;
  Matrix<float,_3,_4> local_88;
  int aiStack_50 [6];
  float local_38;
  undefined8 uStack_34;
  float fStack_2c;
  float local_28;
  float local_24;
  undefined8 local_20;
  
  pfVar1 = local_b8.m_data.m_data[0].m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    pfVar8 = (float *)&local_b8;
    bVar12 = true;
    do {
      bVar3 = bVar12;
      lVar9 = 0;
      auVar11 = _DAT_019f34d0;
      do {
        bVar12 = SUB164(auVar11 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar11 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar12) {
          fVar13 = 1.0;
          if (lVar5 != lVar9) {
            fVar13 = 0.0;
          }
          pfVar8[lVar9 * 2] = fVar13;
        }
        if (bVar12) {
          fVar13 = 1.0;
          if (lVar5 + -1 != lVar9) {
            fVar13 = 0.0;
          }
          pfVar8[lVar9 * 2 + 2] = fVar13;
        }
        lVar9 = lVar9 + 2;
        lVar6 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar6 + 2;
      } while (lVar9 != 4);
      lVar5 = 1;
      pfVar8 = pfVar1;
      bVar12 = false;
    } while (bVar3);
    local_b8.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_b8.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_b8.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    local_b8.m_data.m_data[0].m_data[0] = 0.0;
    local_b8.m_data.m_data[0].m_data[1] = 0.0;
    local_b8.m_data.m_data[1].m_data[0] = 0.0;
    local_b8.m_data.m_data[1].m_data[1] = 0.0;
    local_b8.m_data.m_data[2].m_data[0] = 0.0;
    local_b8.m_data.m_data[2].m_data[1] = 0.0;
    lVar5 = 0;
    pfVar8 = (float *)&local_b8;
    bVar12 = true;
    do {
      bVar3 = bVar12;
      lVar9 = 0;
      do {
        pfVar8[lVar9 * 2] = *(float *)((long)&s_constInMat3x2 + lVar5 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar5 = 0xc;
      pfVar8 = pfVar1;
      bVar12 = false;
    } while (bVar3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = (float *)&local_88;
    lVar5 = 0;
    lVar9 = 0;
    do {
      lVar6 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar5 != lVar6) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar6) = uVar10;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 != 0x30);
      lVar9 = lVar9 + 1;
      pfVar1 = pfVar1 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar9 != 3);
    local_88.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_88.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    local_88.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_88.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_88.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_88.m_data.m_data[3].m_data._4_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 1);
    local_88.m_data.m_data[3].m_data[0] = evalCtx->in[3].m_data[0];
    local_88.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  }
  else {
    pVVar2 = (Vector<float,_3> *)&local_88;
    local_88.m_data.m_data[2].m_data[2] = 0.0;
    local_88.m_data.m_data[3].m_data[0] = 0.0;
    local_88.m_data.m_data[3].m_data[1] = 0.0;
    local_88.m_data.m_data[3].m_data[2] = 0.0;
    local_88.m_data.m_data[1].m_data[1] = 0.0;
    local_88.m_data.m_data[1].m_data[2] = 0.0;
    local_88.m_data.m_data[2].m_data[0] = 0.0;
    local_88.m_data.m_data[2].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[0] = 0.0;
    local_88.m_data.m_data[0].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[2] = 0.0;
    local_88.m_data.m_data[1].m_data[0] = 0.0;
    puVar4 = &DAT_01beaf70;
    lVar5 = 0;
    do {
      lVar9 = 0;
      pVVar7 = pVVar2;
      do {
        ((Vector<tcu::Vector<float,_3>,_4> *)pVVar7->m_data)->m_data[0].m_data[0] =
             (float)puVar4[lVar9];
        lVar9 = lVar9 + 1;
        pVVar7 = pVVar7 + 1;
      } while (lVar9 != 4);
      lVar5 = lVar5 + 1;
      pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
      puVar4 = puVar4 + 4;
    } while (lVar5 != 3);
  }
  tcu::operator*(&local_b8,&local_88);
  local_98 = CONCAT44((float)((ulong)local_20 >> 0x20) +
                      fStack_2c + (float)((ulong)uStack_34 >> 0x20),
                      (float)local_20 + local_38 + (float)uStack_34);
  local_90 = local_28 + local_24;
  aiStack_50[2] = 0;
  aiStack_50[3] = 1;
  aiStack_50[4] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_50[lVar5]] = afStack_a0[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}